

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ncsd.c
# Opt level: O0

int ncsd_open(NCSDContext *context,char *filename)

{
  FILE *__stream;
  int result;
  FILE *fd;
  char *filename_local;
  NCSDContext *context_local;
  
  __stream = fopen64(filename,"rb");
  if (__stream == (FILE *)0x0) {
    context_local._4_4_ = -1;
  }
  else {
    context->fd = __stream;
    fread(&context->header,0x200,1,__stream);
    if (*(int *)(context->header).magic == 0x4453434e) {
      context_local._4_4_ = read_ncch(context);
      if (context_local._4_4_ == 0) {
        context_local._4_4_ = 0;
      }
      else {
        fclose(__stream);
      }
    }
    else {
      fclose(__stream);
      context_local._4_4_ = -2;
    }
  }
  return context_local._4_4_;
}

Assistant:

int ncsd_open(NCSDContext *context, const char *filename) {
    FILE *fd = fopen(filename, "rb");
    int result;
    if (fd == NULL) return NCSD_FILE_NOT_FOUND;
    context->fd = fd;
    fread(&context->header, sizeof(NCSDHeader), 1, fd);
    if (memcmp(context->header.magic, "NCSD", 4) != 0) {
        fclose(fd);
        return NCSD_INVALID_NCSD_HEADER;
    }
    result = read_ncch(context);
    if (result != NCSD_OK) {
        fclose(fd);
        return result;
    }
    return NCSD_OK;
}